

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.cpp
# Opt level: O1

GeneticAlgorithm * __thiscall GeneticAlgorithm::setPopulationSize(GeneticAlgorithm *this,int x)

{
  string *psVar1;
  
  if (1 < x) {
    this->destinatedPopulationSize = x;
    return this;
  }
  psVar1 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar1 = psVar1 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar1,"Population size too small","");
  __cxa_throw(psVar1,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

GeneticAlgorithm& GeneticAlgorithm::setPopulationSize(int x){ 
	if(x<2) throw std::string("Population size too small");
		destinatedPopulationSize = x;
	return *this;
}